

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DGXMLScanner::scanCharData(DGXMLScanner *this,XMLBuffer *toUse)

{
  ReaderMgr *this_00;
  XMLSize_t XVar1;
  XMLCh *toCheck;
  uint uVar2;
  bool bVar3;
  XMLCh toAppend;
  int iVar4;
  int iVar5;
  StackElem *pSVar6;
  uint uVar7;
  bool escaped;
  XMLCh nextCh;
  bool local_51;
  uint local_50;
  XMLCh secondCh;
  XMLCh tmpBuf [9];
  
  toUse->fIndex = 0;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_51 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = true;
  secondCh = L'\0';
  escaped = false;
  uVar7 = 0;
  bVar3 = true;
  iVar5 = 0;
  do {
    uVar2 = uVar7;
    if (!bVar3) {
      if (((this->super_XMLScanner).fValidate == true) &&
         ((this->super_XMLScanner).fStandalone == true)) {
        XVar1 = toUse->fIndex;
        toCheck = toUse->fBuffer;
        toCheck[XVar1] = L'\0';
        bVar3 = XMLReader::containsWhiteSpace
                          ((this->super_XMLScanner).fReaderMgr.fCurReader,toCheck,XVar1);
        if (bVar3) {
          pSVar6 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
          if ((pSVar6->fThisElement->fExternalElement == true) &&
             (iVar5 = (*(pSVar6->fThisElement->super_XSerializable)._vptr_XSerializable[6])(),
             iVar5 == 1)) {
            XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
          }
        }
      }
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,toUse);
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = local_51;
      return;
    }
LAB_002a1979:
    local_50 = uVar2;
    if ((iVar5 == 0) && ((uVar7 & 1) == 0)) {
      ReaderMgr::movePlainContentChars(this_00,toUse);
    }
    bVar3 = ReaderMgr::getNextCharIfNot(this_00,L'<',&nextCh);
    if (bVar3) {
      escaped = false;
      if (nextCh == L'&') {
        (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                  (this,toUse);
        bVar3 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
        (this->super_XMLScanner).fReaderMgr.fThrowEOE = false;
        iVar4 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler
                  [0xd])(this,0,&nextCh,&secondCh,&escaped);
        if (iVar4 != 1) {
          (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar3;
          uVar7 = 0;
          uVar2 = local_50;
          goto LAB_002a1979;
        }
        if ((escaped == true) && (XVar1 = (this->super_XMLScanner).fElemStack.fStackTop, XVar1 != 0)
           ) {
          (this->super_XMLScanner).fElemStack.fStack[XVar1 - 1]->fReferenceEscaped = true;
        }
        (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar3;
        local_50 = uVar7;
      }
      else {
        if ((nextCh & 0xfc00U) == 0xdc00) {
          if ((uVar7 & 1) == 0) {
            XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
          }
        }
        else {
          if ((nextCh & 0xfc00U) == 0xd800) {
            local_50 = (uint)CONCAT71((uint7)(byte)((ushort)nextCh >> 8),1);
            if ((uVar7 & 1) != 0) {
              XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
              local_50 = uVar7;
            }
            goto LAB_002a1afc;
          }
          if ((uVar7 & 1) != 0) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)nextCh] &
              0x40) == 0) {
            XMLString::binToText
                      ((uint)(ushort)nextCh,tmpBuf,8,0x10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacter,tmpBuf,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
        }
        local_50 = 0;
      }
LAB_002a1afc:
      toAppend = nextCh;
      iVar4 = 0;
      if (escaped == false) {
        if (nextCh == L'>') {
          toAppend = L'>';
          iVar4 = 0;
          if (iVar5 == 2) {
            XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
            toAppend = nextCh;
            iVar4 = 0;
          }
        }
        else {
          iVar4 = 0;
          if (nextCh == L']') {
            toAppend = L']';
            if (iVar5 == 0) {
              iVar4 = 1;
            }
            else {
              iVar4 = iVar5;
              if (iVar5 == 1) {
                iVar4 = 2;
              }
            }
          }
        }
      }
      XMLBuffer::append(toUse,toAppend);
      uVar7 = local_50;
      uVar2 = local_50;
      iVar5 = iVar4;
      if (secondCh != L'\0') {
        XMLBuffer::append(toUse,secondCh);
        secondCh = L'\0';
        uVar7 = local_50;
        uVar2 = local_50;
      }
      goto LAB_002a1979;
    }
    bVar3 = false;
    if ((uVar7 & 1) != 0) {
      bVar3 = false;
      XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
    }
  } while( true );
}

Assistant:

void DGXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                    else
                    {
                        if (escaped && !fElemStack.isEmpty())
                            fElemStack.setReferenceEscaped();
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate)
                            emitError(XMLErrs::Expected2ndSurrogateChar);

                        // Make sure the returned char is a valid XML char
                        if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                 // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Check the validity constraints as per XML 1.0 Section 2.9
    if (fValidate && fStandalone)
    {
        // See if the text contains whitespace
        // Get the raw data we need for the callback
        const XMLCh* rawBuf = toUse.getRawBuffer();
        const XMLSize_t len = toUse.getLen();
        const bool isSpaces = fReaderMgr.getCurrentReader()->containsWhiteSpace(rawBuf, len);

        if (isSpaces)
        {
            // And see if the current element is a 'Children' style content model
            const ElemStack::StackElem* topElem = fElemStack.topElement();

            if (topElem->fThisElement->isExternal()) {

                // Get the character data opts for the current element
                XMLElementDecl::CharDataOpts charOpts =  topElem->fThisElement->getCharDataOpts();

                if (charOpts == XMLElementDecl::SpacesOk)  // => Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    //
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                }
            }
        }
    }
    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}